

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s_unittest.cpp
# Opt level: O0

void __thiscall
SortMapSUnitTest_default_constructor_Test::TestBody(SortMapSUnitTest_default_constructor_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_7e8;
  Message local_7e0 [3];
  size_type local_7c8;
  unsigned_long local_7c0;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar;
  MyMap m;
  SortMapSUnitTest_default_constructor_Test *this_local;
  
  estl::
  sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
  ::sort_map_s((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                *)&gtest_ar.message_);
  local_7c0 = 0;
  local_7c8 = estl::
              sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
              ::size((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                      *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_7b8,"static_cast<size_t>(0u)","m.size()",&local_7c0,&local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar1) {
    testing::Message::Message(local_7e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_7b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x3f,message);
    testing::internal::AssertHelper::operator=(&local_7e8,local_7e0);
    testing::internal::AssertHelper::~AssertHelper(&local_7e8);
    testing::Message::~Message(local_7e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  estl::
  sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
  ::~sort_map_s((sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
                 *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SortMapSUnitTest, default_constructor)
{
    using MyMap = estl::sort_map_s<std::string, std::string, 30>;
    MyMap m;
    EXPECT_EQ(static_cast<size_t>(0u), m.size());
}